

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.h
# Opt level: O1

int64 __thiscall sc_dt::sc_proxy<sc_dt::sc_bv_base>::to_int64(sc_proxy<sc_dt::sc_bv_base> *this)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  sc_bv_base *x;
  
  iVar1 = *(int *)&this[1]._vptr_sc_proxy;
  if (iVar1 < 0x21) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(uint *)((long)this[2]._vptr_sc_proxy + 4) << 0x20;
  }
  uVar4 = *(uint *)this[2]._vptr_sc_proxy | uVar4;
  if (iVar1 < 0x40) {
    uVar3 = iVar1 - 1;
    uVar5 = iVar1 + 0x1e;
    if (-1 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if ((*(uint *)((long)this[2]._vptr_sc_proxy + (long)((int)uVar5 >> 5) * 4) >> (uVar3 & 0x1f) & 1
        ) == 0) {
      bVar2 = -(byte)iVar1;
      return (uVar4 << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
    }
    uVar4 = uVar4 | -1L << ((byte)iVar1 & 0x3f);
  }
  return uVar4;
}

Assistant:

int length() const
	{ return m_len; }